

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O1

void __thiscall
timertt::details::
timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::heap_add(timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
           *this,timer_type *timer)

{
  vector<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
  *this_00;
  pointer *ppptVar1;
  iterator __position;
  ulong uVar2;
  pointer pptVar3;
  timer_type *ptVar4;
  size_t sVar5;
  unsigned_long __tmp;
  timer_type *local_10;
  
  this_00 = &this->m_heap;
  __position._M_current =
       (this->m_heap).
       super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  timer->m_position =
       ((long)__position._M_current -
        (long)(this->m_heap).
              super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) + 1;
  local_10 = timer;
  if (__position._M_current ==
      (this->m_heap).
      super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>::timer_type*,std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>::timer_type*>>
    ::
    _M_realloc_insert<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>::timer_type*const&>
              ((vector<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>::timer_type*,std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>::timer_type*>>
                *)this_00,__position,&local_10);
  }
  else {
    *__position._M_current = timer;
    ppptVar1 = &(this->m_heap).
                super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppptVar1 = *ppptVar1 + 1;
  }
  uVar2 = local_10->m_position;
  while( true ) {
    if (uVar2 == 1) {
      return;
    }
    pptVar3 = (this_00->
              super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ptVar4 = pptVar3[(uVar2 >> 1) - 1];
    if ((ptVar4->m_when).__d.__r <= (local_10->m_when).__d.__r) break;
    pptVar3[uVar2 - 1] = ptVar4;
    sVar5 = ptVar4->m_position;
    (this_00->
    super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
    )._M_impl.super__Vector_impl_data._M_start[sVar5 - 1] = local_10;
    local_10->m_position = sVar5;
    ptVar4->m_position = uVar2;
    uVar2 = local_10->m_position;
  }
  return;
}

Assistant:

void
	heap_add( timer_type * timer )
	{
		timer->m_position = m_heap.size() + 1;
		m_heap.push_back( timer );

		while( 1 != timer->m_position )
		{
			auto parent = heap_item( timer->m_position / 2 );
			if( parent->m_when > timer->m_when )
			{
				// timer must be heap-up on the place of the parent node.
				heap_swap( timer, parent );
			}
			else
				// There is no need to modify heap structure anymore.
				break;
		}
	}